

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::AssemblyContext::recordTypeIdForValue(AssemblyContext *this,uint32_t value,uint32_t type)

{
  DiagnosticStream *this_00;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_unsigned_int>_&&>::value,_pair<iterator,_bool>_>
  _Var1;
  DiagnosticStream local_238;
  _Swallow_assign local_60 [16];
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_50;
  undefined1 local_48;
  pair<unsigned_int,_unsigned_int> local_40;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  local_38;
  byte local_21;
  uint32_t local_20;
  uint32_t uStack_1c;
  bool successfully_inserted;
  uint32_t type_local;
  uint32_t value_local;
  AssemblyContext *this_local;
  
  local_21 = 0;
  local_20 = type;
  uStack_1c = value;
  _type_local = this;
  local_40 = std::make_pair<unsigned_int&,unsigned_int&>(&stack0xffffffffffffffe4,&local_20);
  _Var1 = std::
          unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::insert<std::pair<unsigned_int,unsigned_int>>
                    ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                      *)&this->value_types_,&local_40);
  local_50._M_cur =
       (__node_type *)
       _Var1.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
       _M_cur;
  local_48 = _Var1.second;
  local_38.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)local_50._M_cur;
  local_38.second = (bool)local_48;
  std::tie<std::_Swallow_assign_const,bool>(local_60,(bool *)&std::ignore);
  std::tuple<std::_Swallow_assign_const&,bool&>::operator=
            ((tuple<std::_Swallow_assign_const&,bool&> *)local_60,&local_38);
  if ((local_21 & 1) == 0) {
    diagnostic(&local_238,this);
    this_00 = DiagnosticStream::operator<<
                        (&local_238,(char (*) [37])"Value is being defined a second time");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this_00);
    DiagnosticStream::~DiagnosticStream(&local_238);
  }
  else {
    this_local._4_4_ = SPV_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t AssemblyContext::recordTypeIdForValue(uint32_t value,
                                                   uint32_t type) {
  bool successfully_inserted = false;
  std::tie(std::ignore, successfully_inserted) =
      value_types_.insert(std::make_pair(value, type));
  if (!successfully_inserted)
    return diagnostic() << "Value is being defined a second time";
  return SPV_SUCCESS;
}